

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall higan::TcpConnection::OnReadable(TcpConnection *this)

{
  bool bVar1;
  int fd;
  enable_shared_from_this<higan::TcpConnection> local_28;
  ssize_t local_18;
  ssize_t len;
  TcpConnection *this_local;
  
  len = (ssize_t)this;
  fd = Socket::GetFd(&this->socket_);
  local_18 = Buffer::ReadFromFd(&this->input_buffer_,fd);
  if (local_18 == 0) {
    OnError(this);
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&this->message_callback_);
    if (bVar1) {
      std::enable_shared_from_this<higan::TcpConnection>::shared_from_this(&local_28);
      std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&,_higan::Buffer_*)>::
      operator()(&this->message_callback_,(shared_ptr<higan::TcpConnection> *)&local_28,
                 &this->input_buffer_);
      std::shared_ptr<higan::TcpConnection>::~shared_ptr
                ((shared_ptr<higan::TcpConnection> *)&local_28);
    }
  }
  return;
}

Assistant:

void TcpConnection::OnReadable()
{
	ssize_t len = input_buffer_.ReadFromFd(socket_.GetFd());

	if (len == 0)
	{
		OnError();
	}
	else
	{
		if (message_callback_)
		{
			message_callback_(shared_from_this(), &input_buffer_);
		}
	}
}